

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_escaping.cc
# Opt level: O1

void __thiscall
google::protobuf::util::converter::JsonEscaping::Escape
          (JsonEscaping *this,StringPiece input,ByteSink *output)

{
  JsonEscaping JVar1;
  char *pcVar2;
  ByteSink *output_00;
  bool bVar3;
  ByteSource local_20;
  ArrayByteSource source;
  
  output_00 = (ByteSink *)input.length_;
  source.input_.ptr_ = input.ptr_;
  if (source.input_.ptr_ != (char *)0x0) {
    bVar3 = true;
    pcVar2 = (char *)0x0;
    do {
      JVar1 = this[(long)pcVar2];
      if ((0x5e < (byte)((char)JVar1 - 0x20U)) ||
         (((byte)JVar1 - 0x22 < 0x3b &&
          ((0x400000014000001U >> ((ulong)((byte)JVar1 - 0x22) & 0x3f) & 1) != 0)))) {
        bVar3 = false;
      }
    } while (((byte)((char)JVar1 - 0x20U) < 0x5f) &&
            (((0x3a < (byte)JVar1 - 0x22 ||
              ((0x400000014000001U >> ((ulong)((byte)JVar1 - 0x22) & 0x3f) & 1) == 0)) &&
             (pcVar2 = pcVar2 + 1, source.input_.ptr_ != pcVar2))));
    if (!bVar3) {
      local_20._vptr_ByteSource = (_func_int **)&PTR__ByteSource_003c45d0;
      source.super_ByteSource._vptr_ByteSource = (_func_int **)this;
      Escape(&local_20,output_00);
      return;
    }
  }
  (*output_00->_vptr_ByteSink[2])(output_00,this,source.input_.ptr_,output_00->_vptr_ByteSink[2]);
  return;
}

Assistant:

void JsonEscaping::Escape(StringPiece input, strings::ByteSink* output) {
  const size_t len = input.length();
  const char* p = input.data();

  bool can_skip_escaping = true;
  for (int i = 0; i < len; i++) {
    char c = p[i];
    if (c < 0x20 || c >= 0x7F || c == '"' || c == '<' || c == '>' ||
        c == '\\') {
      can_skip_escaping = false;
      break;
    }
  }

  if (can_skip_escaping) {
    output->Append(input.data(), input.length());
  } else {
    strings::ArrayByteSource source(input);
    Escape(&source, output);
  }
}